

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::TPZParFrontMatrix(TPZParFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                    *this,int64_t globalsize)

{
  TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  *unaff_retaddr;
  TPZStack<TPZEqnArray<std::complex<float>_>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<std::complex<float>,TPZStackEqnStorage<std::complex<float>>,TPZFrontSym<std::complex<float>>>>
            (in_RDI,0x21);
  TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ::TPZFrontMatrix(unaff_retaddr,(void **)vtt,(int64_t)in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02554178;
  TPZStack<TPZEqnArray<std::complex<float>_>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 130000) = 0;
  *(undefined8 *)(in_RDI + 0x1fbe8) = 0;
  *(undefined8 *)(in_RDI + 0x1fbf0) = 0;
  *(undefined8 *)(in_RDI + 0x1fbd8) = 0;
  *(undefined8 *)(in_RDI + 0x1fbe0) = 0;
  *(undefined8 *)(in_RDI + 0x1fbf8) = 0;
  std::mutex::mutex((mutex *)0x1d43223);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x1fc00));
  TPZManVector<TPZEqnArray<std::complex<float>_>_*,_10>::Resize(in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix<TVar, store, front>::TPZParFrontMatrix(int64_t globalsize) :
TPZRegisterClassId(&TPZParFrontMatrix::ClassId), TPZFrontMatrix<TVar, store, front>(globalsize),
fFinish(0), fwritelock(), fwritecond()
{
	fEqnStack.Resize(0);
}